

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O2

ESlotDef __thiscall FWeaponSlots::AddDefaultWeapon(FWeaponSlots *this,int slot,PClassWeapon *type)

{
  bool bVar1;
  ESlotDef EVar2;
  int index;
  int currSlot;
  
  bVar1 = LocateWeapon(this,type,&currSlot,&index);
  EVar2 = SLOTDEF_Exists;
  if (!bVar1) {
    if ((uint)slot < 10) {
      bVar1 = FWeaponSlot::AddWeapon(this->Slots + (uint)slot,type);
      EVar2 = SLOTDEF_Full - bVar1;
    }
    else {
      EVar2 = SLOTDEF_Full;
    }
  }
  return EVar2;
}

Assistant:

ESlotDef FWeaponSlots::AddDefaultWeapon (int slot, PClassWeapon *type)
{
	int currSlot, index;

	if (!LocateWeapon (type, &currSlot, &index))
	{
		if (slot >= 0 && slot < NUM_WEAPON_SLOTS)
		{
			bool added = Slots[slot].AddWeapon (type);
			return added ? SLOTDEF_Added : SLOTDEF_Full;
		}
		return SLOTDEF_Full;
	}
	return SLOTDEF_Exists;
}